

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool testing::Test::HasFatalFailure(void)

{
  bool bVar1;
  UnitTestImpl *this;
  TestResult *this_00;
  
  this = internal::GetUnitTestImpl();
  this_00 = internal::UnitTestImpl::current_test_result(this);
  bVar1 = TestResult::HasFatalFailure(this_00);
  return bVar1;
}

Assistant:

bool Test::HasFatalFailure() {
  return internal::GetUnitTestImpl()->current_test_result()->HasFatalFailure();
}